

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O2

bool __thiscall ObjectList::hit(ObjectList *this,Ray *r,double t_min,double t_max,Hit *rec)

{
  pointer psVar1;
  element_type *peVar2;
  int iVar3;
  bool bVar4;
  shared_ptr<Object> *object;
  pointer psVar5;
  Hit temp_hit;
  double local_98;
  Hit local_88;
  
  local_88.material_.super___shared_ptr<Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_88.material_.super___shared_ptr<Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.p_.e[0] = 0.0;
  local_88.p_.e[1] = 0.0;
  local_88.p_.e[2] = 0.0;
  local_88.n_.e[0] = 0.0;
  local_88.n_.e[1] = 0.0;
  local_88.n_.e[2] = 0.0;
  psVar1 = (this->objects_).
           super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar4 = false;
  local_98 = t_max;
  for (psVar5 = (this->objects_).
                super__Vector_base<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    peVar2 = (psVar5->super___shared_ptr<Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar3 = (**peVar2->_vptr_Object)(t_min,local_98,peVar2,r,&local_88);
    if (((char)iVar3 != '\0') && (local_88.t_ < local_98)) {
      local_98 = local_88.t_;
      Hit::operator=(rec,&local_88);
      bVar4 = true;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.material_.super___shared_ptr<Material,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar4;
}

Assistant:

bool ObjectList::hit(const Ray& r, double t_min, double t_max, Hit& rec) const {
  Hit temp_hit;
  bool hit_something = false;
  double t_curr = t_max;

  for (const auto& object : objects_) {
    if (object->hit(r, t_min, t_curr, temp_hit) && temp_hit.t_ < t_curr) {
      hit_something = true;
      t_curr = temp_hit.t_;
      rec = temp_hit;
    }
  }
  return hit_something;
}